

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

void ixxx::posix::spawn_file_actions_addopen
               (posix_spawn_file_actions_t *as,int fd,char *path,int flags,mode_t mode)

{
  int iVar1;
  spawn_file_actions_addopen_error *this;
  
  iVar1 = posix_spawn_file_actions_addopen((posix_spawn_file_actions_t *)as,fd,path,flags,mode);
  if (iVar1 == 0) {
    return;
  }
  this = (spawn_file_actions_addopen_error *)__cxa_allocate_exception(0x20);
  spawn_file_actions_addopen_error::sys_error(this,iVar1,(char *)0x0,ERRNO);
  __cxa_throw(this,&spawn_file_actions_addopen_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

void spawn_file_actions_addopen(posix_spawn_file_actions_t *as,
            int fd, const char *path, int flags, mode_t mode)
    {
        int r = ::posix_spawn_file_actions_addopen(as, fd, path, flags, mode);
        if (r)
            throw spawn_file_actions_addopen_error(r);
    }